

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddApa.c
# Opt level: O1

DdApaDigit
Cudd_ApaShortDivision(int digits,DdApaNumber dividend,DdApaDigit divisor,DdApaNumber quotient)

{
  ulong uVar1;
  DdApaDigit DVar2;
  ulong uVar4;
  ulong uVar3;
  
  if (digits < 1) {
    DVar2 = 0;
  }
  else {
    uVar4 = 0;
    uVar3 = 0;
    do {
      uVar1 = (ulong)dividend[uVar4] | uVar3 << 0x20;
      uVar3 = uVar1 % (ulong)divisor;
      DVar2 = (DdApaDigit)uVar3;
      quotient[uVar4] = (DdApaDigit)(uVar1 / divisor);
      uVar4 = uVar4 + 1;
    } while ((uint)digits != uVar4);
  }
  return DVar2;
}

Assistant:

DdApaDigit
Cudd_ApaShortDivision(
  int  digits,
  DdApaNumber  dividend,
  DdApaDigit  divisor,
  DdApaNumber  quotient)
{
    int i;
    DdApaDigit remainder;
    DdApaDoubleDigit partial;

    remainder = 0;
    for (i = 0; i < digits; i++) {
        partial = remainder * DD_APA_BASE + dividend[i];
        quotient[i] = (DdApaDigit) (partial/(DdApaDoubleDigit)divisor);
        remainder = (DdApaDigit) (partial % divisor);
    }

    return(remainder);

}